

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O2

int libssh2_poll(LIBSSH2_POLLFD *fds,uint nfds,long timeout)

{
  uchar uVar1;
  short sVar2;
  int iVar3;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  LIBSSH2_SESSION *session;
  LIBSSH2_SESSION *pLVar11;
  ulong __nfds;
  timeval tv_end;
  timeval tv_begin;
  pollfd sockets [256];
  
  iVar10 = -1;
  if (nfds < 0x101) {
    __nfds = (ulong)nfds;
    session = (LIBSSH2_SESSION *)0x0;
    for (lVar8 = 0; __nfds * 8 - lVar8 != 0; lVar8 = lVar8 + 8) {
      *(undefined8 *)((long)&fds->revents + lVar8 * 4) = 0;
      uVar1 = (&fds->type)[lVar8 * 4];
      if (uVar1 == '\x03') {
        pLVar11 = *(LIBSSH2_SESSION **)(*(long *)((long)&fds->fd + lVar8 * 4) + 0x18);
LAB_00112012:
        *(libssh2_socket_t *)((long)&sockets[0].fd + lVar8) = pLVar11->socket_fd;
        *(undefined4 *)((long)&sockets[0].events + lVar8) = 1;
        if (session == (LIBSSH2_SESSION *)0x0) {
          session = pLVar11;
        }
      }
      else {
        if (uVar1 == '\x02') {
          pLVar11 = *(LIBSSH2_SESSION **)(*(long *)((long)&fds->fd + lVar8 * 4) + 0x70);
          goto LAB_00112012;
        }
        if (uVar1 != '\x01') {
          if (session == (LIBSSH2_SESSION *)0x0) {
            return -1;
          }
          _libssh2_error(session,-0x23,"Invalid descriptor passed to libssh2_poll()");
          return -1;
        }
        *(undefined4 *)((long)&sockets[0].fd + lVar8) = *(undefined4 *)((long)&fds->fd + lVar8 * 4);
        *(undefined2 *)((long)&sockets[0].events + lVar8) =
             *(undefined2 *)((long)&fds->events + lVar8 * 4);
        *(undefined2 *)((long)&sockets[0].revents + lVar8) = 0;
      }
    }
    do {
      iVar10 = 0;
      for (lVar8 = 0; __nfds << 5 != lVar8; lVar8 = lVar8 + 0x20) {
        uVar4 = *(ulong *)((long)&fds->events + lVar8);
        uVar9 = *(ulong *)((long)&fds->revents + lVar8);
        uVar6 = uVar4;
        if (uVar4 != uVar9) {
          if ((&fds->type)[lVar8] == '\x03') {
            if ((uVar9 & 1) == 0 && (uVar4 & 1) != 0) {
              pvVar5 = _libssh2_list_first((list_head *)(*(long *)((long)&fds->fd + lVar8) + 0x30));
              uVar9 = (ulong)(pvVar5 != (void *)0x0) | *(ulong *)((long)&fds->revents + lVar8);
              *(ulong *)((long)&fds->revents + lVar8) = uVar9;
            }
            lVar7 = *(long *)(*(long *)((long)&fds->fd + lVar8) + 0x18);
          }
          else {
            uVar6 = uVar9;
            if ((&fds->type)[lVar8] != '\x02') goto LAB_0011216e;
            if ((uVar9 & 1) == 0 && (uVar4 & 1) != 0) {
              iVar3 = libssh2_poll_channel_read(*(LIBSSH2_CHANNEL **)((long)&fds->fd + lVar8),0);
              uVar9 = (ulong)(iVar3 != 0) | *(ulong *)((long)&fds->revents + lVar8);
              *(ulong *)((long)&fds->revents + lVar8) = uVar9;
              uVar4 = *(ulong *)((long)&fds->events + lVar8);
            }
            if (((uVar4 & 2) != 0) && ((uVar9 & 2) == 0)) {
              iVar3 = libssh2_poll_channel_read(*(LIBSSH2_CHANNEL **)((long)&fds->fd + lVar8),1);
              uVar9 = (ulong)((uint)(iVar3 != 0) * 2) | *(ulong *)((long)&fds->revents + lVar8);
              *(ulong *)((long)&fds->revents + lVar8) = uVar9;
              uVar4 = *(ulong *)((long)&fds->events + lVar8);
            }
            if (((uVar4 & 4) != 0) && ((uVar9 & 4) == 0)) {
              uVar9 = uVar9 + (ulong)(*(int *)(*(long *)((long)&fds->fd + lVar8) + 0x40) != 0) * 4;
              *(ulong *)((long)&fds->revents + lVar8) = uVar9;
            }
            lVar7 = *(long *)((long)&fds->fd + lVar8);
            if ((*(char *)(lVar7 + 0x5c) != '\0') || (*(char *)(lVar7 + 0x48) != '\0')) {
              uVar9 = uVar9 | 0x80;
              *(ulong *)((long)&fds->revents + lVar8) = uVar9;
            }
            lVar7 = *(long *)(lVar7 + 0x70);
          }
          uVar6 = uVar9;
          if (*(int *)(lVar7 + 0x25c) == -1) {
            *(ulong *)((long)&fds->revents + lVar8) = uVar9 | 0x90;
            uVar6 = 1;
          }
        }
LAB_0011216e:
        iVar10 = (iVar10 + 1) - (uint)(uVar6 == 0);
      }
      if (iVar10 != 0) {
        timeout = 0;
      }
      gettimeofday((timeval *)&tv_begin,(__timezone_ptr_t)0x0);
      iVar3 = poll((pollfd *)sockets,__nfds,(int)timeout);
      gettimeofday((timeval *)&tv_end,(__timezone_ptr_t)0x0);
      lVar8 = tv_end.tv_sec - tv_begin.tv_sec;
      lVar7 = tv_end.tv_usec - tv_begin.tv_usec;
      if (0 < iVar3) {
        for (uVar9 = 0; uVar9 != __nfds; uVar9 = uVar9 + 1) {
          uVar1 = fds[uVar9].type;
          if (uVar1 == '\x03') {
            if ((sockets[uVar9].events & 1) != 0) {
              do {
                iVar3 = _libssh2_transport_read((fds[uVar9].fd.listener)->session);
              } while (0 < iVar3);
            }
LAB_0011225f:
            if ((sockets[uVar9].revents & 0x10) != 0) {
              *(byte *)&fds[uVar9].revents = (byte)fds[uVar9].revents | 0x90;
            }
            sockets[uVar9].revents = 0;
          }
          else {
            if (uVar1 == '\x02') {
              if ((sockets[uVar9].events & 1) != 0) {
                do {
                  iVar3 = _libssh2_transport_read((fds[uVar9].fd.channel)->session);
                } while (0 < iVar3);
              }
              goto LAB_0011225f;
            }
            if (uVar1 == '\x01') {
              sVar2 = sockets[uVar9].revents;
              fds[uVar9].revents = (long)sVar2;
              sockets[uVar9].revents = 0;
              iVar10 = (iVar10 + 1) - (uint)((long)sVar2 == 0);
            }
          }
        }
      }
      timeout = timeout + lVar8 * -1000 + lVar7 / -1000;
    } while ((0 < timeout) && (iVar10 == 0));
  }
  return iVar10;
}

Assistant:

LIBSSH2_API int
libssh2_poll(LIBSSH2_POLLFD * fds, unsigned int nfds, long timeout)
{
    long timeout_remaining;
    unsigned int i, active_fds;
#ifdef HAVE_POLL
    LIBSSH2_SESSION *session = NULL;
#ifdef HAVE_ALLOCA
    struct pollfd *sockets = alloca(sizeof(struct pollfd) * nfds);
#else
    struct pollfd sockets[256];

    if(nfds > 256)
        /* systems without alloca use a fixed-size array, this can be fixed if
           we really want to, at least if the compiler is a C99 capable one */
        return -1;
#endif
    /* Setup sockets for polling */
    for(i = 0; i < nfds; i++) {
        fds[i].revents = 0;
        switch(fds[i].type) {
        case LIBSSH2_POLLFD_SOCKET:
            sockets[i].fd = fds[i].fd.socket;
            sockets[i].events = (short)fds[i].events;
            sockets[i].revents = 0;
            break;

        case LIBSSH2_POLLFD_CHANNEL:
            sockets[i].fd = fds[i].fd.channel->session->socket_fd;
            sockets[i].events = POLLIN;
            sockets[i].revents = 0;
            if(!session)
                session = fds[i].fd.channel->session;
            break;

        case LIBSSH2_POLLFD_LISTENER:
            sockets[i].fd = fds[i].fd.listener->session->socket_fd;
            sockets[i].events = POLLIN;
            sockets[i].revents = 0;
            if(!session)
                session = fds[i].fd.listener->session;
            break;

        default:
            if(session)
                _libssh2_error(session, LIBSSH2_ERROR_INVALID_POLL_TYPE,
                               "Invalid descriptor passed to libssh2_poll()");
            return -1;
        }
    }
#elif defined(HAVE_SELECT)
    LIBSSH2_SESSION *session = NULL;
    libssh2_socket_t maxfd = 0;
    fd_set rfds, wfds;
    struct timeval tv;

    FD_ZERO(&rfds);
    FD_ZERO(&wfds);
    for(i = 0; i < nfds; i++) {
        fds[i].revents = 0;
        switch(fds[i].type) {
        case LIBSSH2_POLLFD_SOCKET:
            if(fds[i].events & LIBSSH2_POLLFD_POLLIN) {
                FD_SET(fds[i].fd.socket, &rfds);
                if(fds[i].fd.socket > maxfd)
                    maxfd = fds[i].fd.socket;
            }
            if(fds[i].events & LIBSSH2_POLLFD_POLLOUT) {
                FD_SET(fds[i].fd.socket, &wfds);
                if(fds[i].fd.socket > maxfd)
                    maxfd = fds[i].fd.socket;
            }
            break;

        case LIBSSH2_POLLFD_CHANNEL:
            FD_SET(fds[i].fd.channel->session->socket_fd, &rfds);
            if(fds[i].fd.channel->session->socket_fd > maxfd)
                maxfd = fds[i].fd.channel->session->socket_fd;
            if(!session)
                session = fds[i].fd.channel->session;
            break;

        case LIBSSH2_POLLFD_LISTENER:
            FD_SET(fds[i].fd.listener->session->socket_fd, &rfds);
            if(fds[i].fd.listener->session->socket_fd > maxfd)
                maxfd = fds[i].fd.listener->session->socket_fd;
            if(!session)
                session = fds[i].fd.listener->session;
            break;

        default:
            if(session)
                _libssh2_error(session, LIBSSH2_ERROR_INVALID_POLL_TYPE,
                               "Invalid descriptor passed to libssh2_poll()");
            return -1;
        }
    }
#else
    /* No select() or poll()
     * no sockets structure to setup
     */

    timeout = 0;
#endif /* HAVE_POLL or HAVE_SELECT */

    timeout_remaining = timeout;
    do {
#if defined(HAVE_POLL) || defined(HAVE_SELECT)
        int sysret;
#endif

        active_fds = 0;

        for(i = 0; i < nfds; i++) {
            if(fds[i].events != fds[i].revents) {
                switch(fds[i].type) {
                case LIBSSH2_POLLFD_CHANNEL:
                    if((fds[i].events & LIBSSH2_POLLFD_POLLIN) &&
                        /* Want to be ready for read */
                        ((fds[i].revents & LIBSSH2_POLLFD_POLLIN) == 0)) {
                        /* Not yet known to be ready for read */
                        fds[i].revents |=
                            libssh2_poll_channel_read(fds[i].fd.channel,
                                                      0) ?
                            LIBSSH2_POLLFD_POLLIN : 0;
                    }
                    if((fds[i].events & LIBSSH2_POLLFD_POLLEXT) &&
                        /* Want to be ready for extended read */
                        ((fds[i].revents & LIBSSH2_POLLFD_POLLEXT) == 0)) {
                        /* Not yet known to be ready for extended read */
                        fds[i].revents |=
                            libssh2_poll_channel_read(fds[i].fd.channel,
                                                      1) ?
                            LIBSSH2_POLLFD_POLLEXT : 0;
                    }
                    if((fds[i].events & LIBSSH2_POLLFD_POLLOUT) &&
                        /* Want to be ready for write */
                        ((fds[i].revents & LIBSSH2_POLLFD_POLLOUT) == 0)) {
                        /* Not yet known to be ready for write */
                        fds[i].revents |=
                            poll_channel_write(fds[i].fd. channel) ?
                            LIBSSH2_POLLFD_POLLOUT : 0;
                    }
                    if(fds[i].fd.channel->remote.close
                        || fds[i].fd.channel->local.close) {
                        fds[i].revents |= LIBSSH2_POLLFD_CHANNEL_CLOSED;
                    }
                    if(fds[i].fd.channel->session->socket_state ==
                        LIBSSH2_SOCKET_DISCONNECTED) {
                        fds[i].revents |=
                            LIBSSH2_POLLFD_CHANNEL_CLOSED |
                            LIBSSH2_POLLFD_SESSION_CLOSED;
                    }
                    break;

                case LIBSSH2_POLLFD_LISTENER:
                    if((fds[i].events & LIBSSH2_POLLFD_POLLIN) &&
                        /* Want a connection */
                        ((fds[i].revents & LIBSSH2_POLLFD_POLLIN) == 0)) {
                        /* No connections known of yet */
                        fds[i].revents |=
                            poll_listener_queued(fds[i].fd. listener) ?
                            LIBSSH2_POLLFD_POLLIN : 0;
                    }
                    if(fds[i].fd.listener->session->socket_state ==
                        LIBSSH2_SOCKET_DISCONNECTED) {
                        fds[i].revents |=
                            LIBSSH2_POLLFD_LISTENER_CLOSED |
                            LIBSSH2_POLLFD_SESSION_CLOSED;
                    }
                    break;
                }
            }
            if(fds[i].revents) {
                active_fds++;
            }
        }

        if(active_fds) {
            /* Don't block on the sockets if we have channels/listeners which
               are ready */
            timeout_remaining = 0;
        }
#ifdef HAVE_POLL

        {
            struct timeval tv_begin, tv_end;

            gettimeofday(&tv_begin, NULL);
            sysret = poll(sockets, nfds, (int)timeout_remaining);
            gettimeofday(&tv_end, NULL);
            timeout_remaining -= (tv_end.tv_sec - tv_begin.tv_sec) * 1000;
            timeout_remaining -= (tv_end.tv_usec - tv_begin.tv_usec) / 1000;
        }

        if(sysret > 0) {
            for(i = 0; i < nfds; i++) {
                switch(fds[i].type) {
                case LIBSSH2_POLLFD_SOCKET:
                    fds[i].revents = sockets[i].revents;
                    sockets[i].revents = 0; /* In case we loop again, be
                                               nice */
                    if(fds[i].revents) {
                        active_fds++;
                    }
                    break;
                case LIBSSH2_POLLFD_CHANNEL:
                    if(sockets[i].events & POLLIN) {
                        /* Spin session until no data available */
                        while(_libssh2_transport_read(fds[i].fd.
                                                      channel->session)
                              > 0);
                    }
                    if(sockets[i].revents & POLLHUP) {
                        fds[i].revents |=
                            LIBSSH2_POLLFD_CHANNEL_CLOSED |
                            LIBSSH2_POLLFD_SESSION_CLOSED;
                    }
                    sockets[i].revents = 0;
                    break;
                case LIBSSH2_POLLFD_LISTENER:
                    if(sockets[i].events & POLLIN) {
                        /* Spin session until no data available */
                        while(_libssh2_transport_read(fds[i].fd.
                                                      listener->session)
                              > 0);
                    }
                    if(sockets[i].revents & POLLHUP) {
                        fds[i].revents |=
                            LIBSSH2_POLLFD_LISTENER_CLOSED |
                            LIBSSH2_POLLFD_SESSION_CLOSED;
                    }
                    sockets[i].revents = 0;
                    break;
                }
            }
        }
#elif defined(HAVE_SELECT)
        tv.tv_sec = timeout_remaining / 1000;
#ifdef libssh2_usec_t
        tv.tv_usec = (libssh2_usec_t)((timeout_remaining % 1000) * 1000);
#else
        tv.tv_usec = (timeout_remaining % 1000) * 1000;
#endif

        {
            struct timeval tv_begin, tv_end;

            gettimeofday(&tv_begin, NULL);
            sysret = select((int)(maxfd + 1), &rfds, &wfds, NULL, &tv);
            gettimeofday(&tv_end, NULL);

            timeout_remaining -= (tv_end.tv_sec - tv_begin.tv_sec) * 1000;
            timeout_remaining -= (tv_end.tv_usec - tv_begin.tv_usec) / 1000;
        }

        if(sysret > 0) {
            for(i = 0; i < nfds; i++) {
                switch(fds[i].type) {
                case LIBSSH2_POLLFD_SOCKET:
                    if(FD_ISSET(fds[i].fd.socket, &rfds)) {
                        fds[i].revents |= LIBSSH2_POLLFD_POLLIN;
                    }
                    if(FD_ISSET(fds[i].fd.socket, &wfds)) {
                        fds[i].revents |= LIBSSH2_POLLFD_POLLOUT;
                    }
                    if(fds[i].revents) {
                        active_fds++;
                    }
                    break;

                case LIBSSH2_POLLFD_CHANNEL:
                    if(FD_ISSET(fds[i].fd.channel->session->socket_fd,
                                &rfds)) {
                        /* Spin session until no data available */
                        while(_libssh2_transport_read(fds[i].fd.
                                                      channel->session)
                              > 0);
                    }
                    break;

                case LIBSSH2_POLLFD_LISTENER:
                    if(FD_ISSET
                        (fds[i].fd.listener->session->socket_fd, &rfds)) {
                        /* Spin session until no data available */
                        while(_libssh2_transport_read(fds[i].fd.
                                                      listener->session)
                              > 0);
                    }
                    break;
                }
            }
        }
#endif /* else no select() or poll() -- timeout (and by extension
        * timeout_remaining) will be equal to 0 */
    } while((timeout_remaining > 0) && !active_fds);

    return active_fds;
}